

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall UKF::PredictMeanAndCovariance(UKF *this,MatrixXd *Xsig_pred,VectorXd *x,MatrixXd *P)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pPVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  ActualDstType actualDst_1;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pPVar11;
  Index index;
  ulong uVar12;
  ulong uVar13;
  ActualDstType actualDst;
  double dVar14;
  VectorXd x_diff;
  assign_op<double,_double> local_d1;
  void *local_d0;
  double local_c8;
  undefined1 local_c0 [16];
  scalar_constant_op<double> local_b0;
  MatrixXd *local_a8;
  scalar_constant_op<double> local_a0;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_98;
  ulong local_90;
  RhsNested local_88;
  ulong local_80;
  MatrixXd *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  double local_48;
  undefined8 uStack_40;
  
  lVar8 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar8 < 0) {
    pcVar9 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    if (lVar8 != 0) {
      memset((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
             lVar8 << 3);
    }
    if (0 < this->n_sigma_) {
      lVar8 = 0;
      lVar10 = 0;
      do {
        if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar10) goto LAB_00105a53;
        pdVar2 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        uVar3 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        if ((long)uVar3 < 0 && pdVar2 != (double *)0x0) goto LAB_00105a91;
        if ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar10) goto LAB_00105a72;
        if ((long)uVar3 < 0) {
          pcVar9 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_00105adc;
        }
        if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
            uVar3) {
          pcVar9 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
          ;
          goto LAB_00105afb;
        }
        dVar14 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar10];
        pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        uVar12 = uVar3 & 0x7ffffffffffffffe;
        if (1 < uVar3) {
          uVar13 = 0;
          do {
            dVar6 = (pdVar4 + uVar13)[1];
            pdVar1 = (double *)((long)pdVar2 + uVar13 * 8 + uVar3 * lVar8);
            dVar7 = pdVar1[1];
            pdVar4[uVar13] = *pdVar1 * dVar14 + pdVar4[uVar13];
            (pdVar4 + uVar13)[1] = dVar7 * dVar14 + dVar6;
            uVar13 = uVar13 + 2;
          } while (uVar13 < uVar12);
        }
        if ((long)uVar12 < (long)uVar3) {
          do {
            pdVar4[uVar12] =
                 *(double *)((long)pdVar2 + uVar12 * 8 + uVar3 * lVar8) * dVar14 + pdVar4[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
        }
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 8;
      } while (lVar10 < this->n_sigma_);
    }
    local_c0._0_8_ =
         (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_c0._8_8_ =
         (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    local_b0.m_other = 0.0;
    if (-1 < (long)(local_c0._8_8_ | local_c0._0_8_)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (P,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_c0,(assign_op<double,_double> *)&local_d0);
      if (1 < this->n_sigma_) {
        pPVar11 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x1;
        do {
          pPVar5 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                   (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          uVar3 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
          if ((long)uVar3 < 0 && pPVar5 != (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x0
             ) {
LAB_00105a91:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                         );
          }
          if ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_cols <= (long)pPVar11) {
LAB_00105a72:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                         );
          }
          local_c0._0_8_ = pPVar5 + uVar3 * (long)pPVar11 * 8;
          local_a0.m_other = 0.0;
          local_68 = 0;
          uStack_60 = 0;
          local_c0._8_8_ = uVar3;
          local_a8 = Xsig_pred;
          local_98 = pPVar11;
          local_90 = uVar3;
          local_88.m_matrix = (non_const_type)pPVar5;
          local_80 = uVar3;
          local_70 = Xsig_pred;
          local_58 = uVar3;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d0,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                      *)local_c0);
          if ((long)local_c8 < 4) {
LAB_00105a53:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_48 = (double)((ulong)*(double *)((long)local_d0 + 0x18) & 0x8000000000000000 |
                             0x400921fb54442d18);
          uStack_40 = 0x400921fb54442d18;
          dVar14 = fmod(*(double *)((long)local_d0 + 0x18) + local_48,6.283185307179586);
          if (((long)local_c8 < 4) ||
             (*(double *)((long)local_d0 + 0x18) = dVar14 - local_48,
             (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows <= (long)pPVar11)) goto LAB_00105a53;
          local_a0.m_other =
               (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[(long)pPVar11];
          local_b0.m_other = local_c8;
          local_c0._0_8_ = P;
          local_98 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d0;
          local_88.m_matrix = (non_const_type)&local_d0;
          if (((double)(P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows != local_c8) ||
             ((double)(P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols != local_c8)) {
            pcVar9 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>]"
            ;
LAB_00105afb:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar9);
          }
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,0>const>,Eigen::internal::assign_op<double,double>>
                    (P,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                        *)local_c0,&local_d1,(type)0x0);
          free(local_d0);
          pPVar11 = pPVar11 + 1;
        } while ((long)pPVar11 < (long)this->n_sigma_);
      }
      return;
    }
    pcVar9 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
LAB_00105adc:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar9);
}

Assistant:

void UKF::PredictMeanAndCovariance(const MatrixXd &Xsig_pred, VectorXd &x, MatrixXd &P) {

  //predicted state mean
  x.fill(0.0);
  for (int i = 0; i < n_sigma_; i++) {  //iterate over sigma points
    x = x + weights_(i) * Xsig_pred.col(i);
  }

  ////predicted state covariance matrix
  //P.fill(0.0);
  //for (int i = 0; i < n_sigma_; i++) {  //iterate over sigma points
  //
  //  // state difference
  //  VectorXd x_diff = Xsig_pred.col(i) - x;
  //  x_diff(3) = normalizeRadiansPiToMinusPi(x_diff(3));
  //
  //  P = P + weights_(i) * x_diff * x_diff.transpose();
  //}

  //predicted state covariance matrix
  P.fill(0.0);
  for (int i = 1; i < n_sigma_; i++) {  //iterate over sigma points

    // state difference
    VectorXd x_diff = Xsig_pred.col(i) - Xsig_pred.col(0);
    x_diff(3) = normalizeRadiansPiToMinusPi(x_diff(3));

    P = P + weights_(i) * x_diff * x_diff.transpose();
  }
}